

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<unsigned_long,unsigned_long>
                   (random_numerators<unsigned_long> *vals,unsigned_long *div)

{
  random_numerators<unsigned_long> *this;
  random_numerators<unsigned_long> *prVar1;
  ulong *in_RSI;
  random_numerators<unsigned_long> *in_RDI;
  const_iterator iter;
  UIntT sum;
  random_numerators<unsigned_long> *prVar2;
  uint64_t local_18;
  
  local_18 = 0;
  this = (random_numerators<unsigned_long> *)random_numerators<unsigned_long>::begin(in_RDI);
  while( true ) {
    prVar2 = this;
    prVar1 = (random_numerators<unsigned_long> *)random_numerators<unsigned_long>::end(this);
    if (this == prVar1) break;
    local_18 = (ulong)prVar2->_pData / *in_RSI + local_18;
    this = (random_numerators<unsigned_long> *)&prVar2->_length;
  }
  return local_18;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}